

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaANCF_3843::LoadableStateIncrement(ChElementHexaANCF_3843 *this)

{
  ChState *in_RCX;
  ChState *in_RDX;
  uint in_ESI;
  uint in_R8D;
  ChStateDelta *in_R9;
  
  LoadableStateIncrement
            ((ChElementHexaANCF_3843 *)
             ((this->super_ChElementHexahedron)._vptr_ChElementHexahedron[-8] +
             (long)&(this->super_ChElementHexahedron)._vptr_ChElementHexahedron),in_ESI,in_RDX,
             in_RCX,in_R8D,in_R9);
  return;
}

Assistant:

void ChElementHexaANCF_3843::LoadableStateIncrement(const unsigned int off_x,
                                                    ChState& x_new,
                                                    const ChState& x,
                                                    const unsigned int off_v,
                                                    const ChStateDelta& Dv) {
    m_nodes[0]->NodeIntStateIncrement(off_x, x_new, x, off_v, Dv);
    m_nodes[1]->NodeIntStateIncrement(off_x + 12, x_new, x, off_v + 12, Dv);
    m_nodes[2]->NodeIntStateIncrement(off_x + 24, x_new, x, off_v + 24, Dv);
    m_nodes[3]->NodeIntStateIncrement(off_x + 36, x_new, x, off_v + 36, Dv);
    m_nodes[4]->NodeIntStateIncrement(off_x + 48, x_new, x, off_v + 48, Dv);
    m_nodes[5]->NodeIntStateIncrement(off_x + 60, x_new, x, off_v + 60, Dv);
    m_nodes[6]->NodeIntStateIncrement(off_x + 72, x_new, x, off_v + 72, Dv);
    m_nodes[7]->NodeIntStateIncrement(off_x + 84, x_new, x, off_v + 84, Dv);
}